

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O3

void iutest::detail::printer_internal2::DefaultPrintNonContainerTo<iutest::detail::iuStreamMessage>
               (iuStreamMessage *value,iu_ostream *os)

{
  long *local_30;
  long local_28;
  long local_20 [2];
  
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_30,local_28);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return;
}

Assistant:

void DefaultPrintNonContainerTo(const T& value, iu_ostream* os)
{
    using namespace ::iutest::detail::printer_internal; // NOLINT
    *os << value;
}